

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# replace.c
# Opt level: O2

void mf_repdata_allocbuf(MF_REPLACEMENT_DATA_t *rd)

{
  uint uVar1;
  AC_ALPHABET_t *pAVar2;
  
  uVar1 = mf_repdata_bookreplacements(rd->trie->root);
  rd->has_replacement = uVar1;
  if (uVar1 != 0) {
    pAVar2 = (AC_ALPHABET_t *)malloc(0x800);
    (rd->buffer).astring = pAVar2;
    pAVar2 = (AC_ALPHABET_t *)malloc(0x400);
    (rd->backlog).astring = pAVar2;
  }
  return;
}

Assistant:

void mf_repdata_allocbuf (MF_REPLACEMENT_DATA_t *rd)
{    
    /* Bookmark replacement pattern for faster retrieval */
    rd->has_replacement = mf_repdata_bookreplacements (rd->trie->root);
    
    if (rd->has_replacement)
    {
        rd->buffer.astring = (AC_ALPHABET_t *) 
                malloc (MF_REPLACEMENT_BUFFER_SIZE * sizeof(AC_ALPHABET_t));
        
        rd->backlog.astring = (AC_ALPHABET_t *) 
                malloc (AC_PATTRN_MAX_LENGTH * sizeof(AC_ALPHABET_t));
        
        /* Backlog length is not bigger than the max pattern length */
    }
}